

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall re2c::OutputFile::OutputFile(OutputFile *this,char *fn)

{
  opt_t *poVar1;
  char *fn_local;
  OutputFile *this_local;
  
  this->file_name = fn;
  this->file = (FILE *)0x0;
  (this->blocks).super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::vector(&this->blocks);
  counter_t<re2c::label_t>::counter_t(&this->label_counter);
  poVar1 = Opt::operator->((Opt *)&opts);
  this->warn_condition_order = (bool)(~poVar1->tFlag & 1);
  new_block(this);
  return;
}

Assistant:

OutputFile::OutputFile (const char * fn)
	: file_name (fn)
	, file (NULL)
	, blocks ()
	, label_counter ()
	, warn_condition_order (!opts->tFlag) // see note [condition order]
{
	new_block ();
}